

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

void inverse_mdct(float *buffer,int n,vorb *f,int blocktype)

{
  undefined8 *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  undefined4 extraout_var;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  ushort *puVar9;
  float *pfVar10;
  int iVar11;
  float *pfVar12;
  vorb **ppvVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vorb *local_b8;
  float *local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  undefined4 uStack_6c;
  float *local_68;
  undefined8 local_60;
  ulong local_58;
  int a_off;
  int local_4c;
  int local_48;
  undefined4 uStack_44;
  float *local_40;
  uint local_34;
  
  local_34 = n;
  iVar7 = n >> 1;
  local_78 = f->temp_offset;
  lVar20 = (long)iVar7;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    pfVar5 = (float *)((long)&local_b8 - (lVar20 * 4 + 0xfU & 0xfffffffffffffff0));
    ppvVar13 = (vorb **)pfVar5;
  }
  else {
    pfVar5 = (float *)setup_temp_malloc(f,iVar7 * 4);
    ppvVar13 = &local_b8;
  }
  pfVar6 = f->A[(uint)blocktype];
  pfVar10 = pfVar5 + lVar20 + -2;
  pfVar8 = pfVar6;
  if (1 < local_34) {
    pfVar12 = buffer;
    do {
      pfVar10[1] = *pfVar12 * *pfVar8 - pfVar8[1] * pfVar12[2];
      *pfVar10 = *pfVar12 * pfVar8[1] + pfVar12[2] * *pfVar8;
      pfVar10 = pfVar10 + -2;
      pfVar8 = pfVar8 + 2;
      pfVar12 = pfVar12 + 4;
    } while (pfVar12 != buffer + lVar20);
  }
  iVar14 = (int)local_34 >> 2;
  if (pfVar5 <= pfVar10) {
    pfVar12 = buffer + lVar20 + -1;
    do {
      pfVar10[1] = pfVar12[-2] * pfVar8[1] - *pfVar12 * *pfVar8;
      *pfVar10 = -*pfVar12 * pfVar8[1] - *pfVar8 * pfVar12[-2];
      pfVar10 = pfVar10 + -2;
      pfVar8 = pfVar8 + 2;
      pfVar12 = pfVar12 + -4;
    } while (pfVar5 <= pfVar10);
  }
  uVar21 = local_34;
  local_a8 = (ulong)(uint)blocktype;
  local_b8 = f;
  local_58 = (ulong)(uint)((int)local_34 >> 3);
  local_88 = lVar20;
  pfVar8 = pfVar6 + lVar20 + -8;
  local_4c = iVar14;
  local_a0 = (long)iVar14;
  if (pfVar6 <= pfVar8) {
    lVar20 = 0;
    do {
      fVar24 = *(float *)((long)pfVar5 + lVar20 + local_a0 * 4 + 4);
      fVar26 = *(float *)((long)pfVar5 + lVar20 + 4);
      fVar23 = *(float *)((long)pfVar5 + lVar20 + local_a0 * 4) - *(float *)((long)pfVar5 + lVar20);
      *(float *)((long)buffer + lVar20 + local_a0 * 4 + 4) = fVar24 + fVar26;
      fVar24 = fVar24 - fVar26;
      *(float *)((long)buffer + lVar20 + local_a0 * 4) =
           *(float *)((long)pfVar5 + lVar20 + local_a0 * 4) + *(float *)((long)pfVar5 + lVar20);
      *(float *)((long)buffer + lVar20 + 4) = pfVar8[4] * fVar24 - pfVar8[5] * fVar23;
      *(float *)((long)buffer + lVar20) = fVar23 * pfVar8[4] + fVar24 * pfVar8[5];
      fVar24 = *(float *)((long)pfVar5 + lVar20 + local_a0 * 4 + 0xc);
      fVar26 = *(float *)((long)pfVar5 + lVar20 + 0xc);
      fVar25 = fVar24 - fVar26;
      fVar23 = *(float *)((long)pfVar5 + lVar20 + local_a0 * 4 + 8) -
               *(float *)((long)pfVar5 + lVar20 + 8);
      *(float *)((long)buffer + lVar20 + local_a0 * 4 + 0xc) = fVar24 + fVar26;
      *(float *)((long)buffer + lVar20 + local_a0 * 4 + 8) =
           *(float *)((long)pfVar5 + lVar20 + local_a0 * 4 + 8) +
           *(float *)((long)pfVar5 + lVar20 + 8);
      *(float *)((long)buffer + lVar20 + 0xc) = *pfVar8 * fVar25 - pfVar8[1] * fVar23;
      *(float *)((long)buffer + lVar20 + 8) = fVar23 * *pfVar8 + fVar25 * pfVar8[1];
      pfVar8 = pfVar8 + -8;
      lVar20 = lVar20 + 0x10;
    } while (pfVar6 <= pfVar8);
  }
  local_b0 = pfVar5;
  local_40 = pfVar6;
  *(float *)((long)ppvVar13 + -8) = 2.316698e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  iVar14 = ilog(uVar21);
  local_60 = CONCAT44(extraout_var,iVar14);
  iVar19 = (int)uVar21 >> 4;
  uVar21 = iVar7 - 1;
  iVar14 = (int)local_58;
  *(float *)((long)ppvVar13 + -8) = 2.316751e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_iter0_loop(iVar19,buffer,uVar21,-iVar14,pfVar6);
  iVar7 = uVar21 - local_4c;
  *(float *)((long)ppvVar13 + -8) = 2.316782e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_iter0_loop(iVar19,buffer,iVar7,-iVar14,pfVar6);
  iVar14 = (int)local_34 >> 5;
  iVar19 = -iVar19;
  *(float *)((long)ppvVar13 + -8) = 2.31683e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar14,buffer,uVar21,iVar19,pfVar6,0x10);
  pfVar5 = local_40;
  iVar7 = (int)local_58;
  *(float *)((long)ppvVar13 + -8) = 2.316876e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar14,buffer,uVar21 - iVar7,iVar19,pfVar5,0x10);
  pfVar5 = local_40;
  *(float *)((long)ppvVar13 + -8) = 2.316925e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar14,buffer,uVar21 + iVar7 * -2,iVar19,pfVar5,0x10);
  iVar7 = (int)local_58;
  local_90 = (ulong)uVar21;
  local_74 = iVar14;
  local_68 = buffer;
  *(float *)((long)ppvVar13 + -8) = 2.316992e-39;
  *(float *)((long)ppvVar13 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar14,buffer,uVar21 + iVar7 * -3,iVar19,pfVar5,0x10);
  pfVar6 = local_40;
  pfVar5 = local_68;
  a_off = (int)local_60 + -4 >> 1;
  iVar7 = 2;
  if (2 < a_off) {
    local_98 = 2;
    do {
      bVar3 = (byte)local_98;
      iVar7 = (int)local_34 >> (bVar3 + 2 & 0x1f);
      _local_48 = CONCAT44(uStack_44,iVar7);
      iVar14 = 2 << (bVar3 & 0x1f);
      if (0 < iVar14) {
        local_7c = (int)local_34 >> (bVar3 + 4 & 0x1f);
        _local_70 = CONCAT44(uStack_6c,-(iVar7 >> 1));
        uVar15 = local_90 & 0xffffffff;
        do {
          iVar7 = local_7c;
          iVar19 = local_70;
          *(float *)((long)ppvVar13 + -8) = 2.317193e-39;
          *(float *)((long)ppvVar13 + -4) = 0.0;
          imdct_step3_inner_r_loop(iVar7,pfVar5,(int)uVar15,iVar19,pfVar6,8 << (bVar3 & 0x1f));
          uVar15 = (ulong)(uint)((int)uVar15 - local_48);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      uVar21 = (int)local_98 + 1;
      local_98 = (ulong)uVar21;
      iVar7 = a_off;
    } while (uVar21 != a_off);
  }
  iVar14 = (int)local_60 + -7;
  if (iVar7 < iVar14) {
    do {
      bVar3 = (byte)iVar7;
      iVar19 = (int)local_34 >> (bVar3 + 6 & 0x1f);
      iVar16 = 2 << (bVar3 & 0x1f);
      if (0 < iVar19) {
        iVar4 = (int)local_34 >> (bVar3 + 2 & 0x1f);
        lVar17 = (long)(8 << (bVar3 & 0x1f));
        iVar11 = 0x10 << (bVar3 & 0x1f);
        lVar18 = (long)(0x18 << (bVar3 & 0x1f));
        lVar20 = (long)(iVar4 >> 1);
        pfVar6 = local_68 + local_88 + -2;
        pfVar5 = local_40;
        do {
          if (0 < iVar16) {
            fVar24 = pfVar5[lVar18];
            fVar26 = pfVar5[lVar18 + 1];
            fVar23 = pfVar5[iVar11];
            fVar25 = pfVar5[iVar11 + 1];
            fVar42 = pfVar5[lVar17];
            fVar27 = pfVar5[lVar17 + 1];
            fVar30 = *pfVar5;
            fVar31 = pfVar5[1];
            pfVar8 = pfVar6;
            iVar22 = iVar16 + 1;
            do {
              fVar28 = (float)*(undefined8 *)pfVar8;
              fVar43 = (float)((ulong)*(undefined8 *)pfVar8 >> 0x20);
              fVar40 = fVar28 - (float)*(undefined8 *)(pfVar8 + -lVar20);
              fVar29 = (float)((ulong)*(undefined8 *)(pfVar8 + -lVar20) >> 0x20);
              fVar41 = fVar43 - fVar29;
              pfVar8[1] = fVar29 + fVar43;
              *pfVar8 = fVar28 + pfVar8[-lVar20];
              *(ulong *)(pfVar8 + -lVar20) =
                   CONCAT44(fVar41 * fVar30 + -fVar40 * fVar31,fVar40 * fVar30 + fVar41 * fVar31);
              fVar28 = (float)*(undefined8 *)(pfVar8 + -2);
              fVar43 = (float)((ulong)*(undefined8 *)(pfVar8 + -2) >> 0x20);
              fVar40 = fVar28 - (float)*(undefined8 *)(pfVar8 + (-2 - lVar20));
              fVar29 = (float)((ulong)*(undefined8 *)(pfVar8 + (-2 - lVar20)) >> 0x20);
              fVar41 = fVar43 - fVar29;
              pfVar8[-1] = fVar29 + fVar43;
              pfVar8[-2] = fVar28 + pfVar8[-2 - lVar20];
              *(ulong *)(pfVar8 + (-2 - lVar20)) =
                   CONCAT44(fVar41 * fVar42 + -fVar40 * fVar27,fVar40 * fVar42 + fVar41 * fVar27);
              fVar28 = (float)*(undefined8 *)(pfVar8 + -4);
              fVar43 = (float)((ulong)*(undefined8 *)(pfVar8 + -4) >> 0x20);
              fVar40 = fVar28 - (float)*(undefined8 *)(pfVar8 + (-4 - lVar20));
              fVar29 = (float)((ulong)*(undefined8 *)(pfVar8 + (-4 - lVar20)) >> 0x20);
              fVar41 = fVar43 - fVar29;
              pfVar8[-3] = fVar29 + fVar43;
              pfVar8[-4] = fVar28 + pfVar8[-4 - lVar20];
              *(ulong *)(pfVar8 + (-4 - lVar20)) =
                   CONCAT44(fVar41 * fVar23 + -fVar40 * fVar25,fVar40 * fVar23 + fVar41 * fVar25);
              fVar28 = (float)*(undefined8 *)(pfVar8 + -6);
              fVar43 = (float)((ulong)*(undefined8 *)(pfVar8 + -6) >> 0x20);
              fVar40 = fVar28 - (float)*(undefined8 *)(pfVar8 + (-6 - lVar20));
              fVar29 = (float)((ulong)*(undefined8 *)(pfVar8 + (-6 - lVar20)) >> 0x20);
              fVar41 = fVar43 - fVar29;
              pfVar8[-5] = fVar29 + fVar43;
              pfVar8[-6] = fVar28 + pfVar8[-6 - lVar20];
              *(ulong *)(pfVar8 + (-6 - lVar20)) =
                   CONCAT44(fVar41 * fVar24 + -fVar40 * fVar26,fVar40 * fVar24 + fVar41 * fVar26);
              pfVar8 = pfVar8 + -(long)iVar4;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          pfVar5 = pfVar5 + (0x20 << (bVar3 & 0x1f));
          pfVar6 = pfVar6 + -8;
          bVar2 = 1 < iVar19;
          iVar19 = iVar19 + -1;
        } while (bVar2);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar14);
  }
  if (0 < local_74) {
    fVar24 = local_40[(int)local_58];
    pfVar5 = local_68 + local_88;
    do {
      pfVar6 = pfVar5 + -0x10;
      fVar34 = (float)*(undefined8 *)(pfVar5 + -2);
      fVar35 = (float)((ulong)*(undefined8 *)(pfVar5 + -2) >> 0x20);
      fVar36 = (float)*(undefined8 *)(pfVar5 + -10);
      fVar23 = fVar34 + fVar36;
      fVar37 = (float)((ulong)*(undefined8 *)(pfVar5 + -10) >> 0x20);
      fVar25 = fVar35 + fVar37;
      *(ulong *)(pfVar5 + -2) = CONCAT44(fVar25,fVar23);
      fVar26 = (float)*(undefined8 *)(pfVar5 + -8);
      fVar42 = (float)((ulong)*(undefined8 *)(pfVar5 + -8) >> 0x20);
      fVar27 = (float)*(undefined8 *)(pfVar5 + -4);
      fVar43 = (float)((ulong)*(undefined8 *)(pfVar5 + -4) >> 0x20);
      fVar32 = (float)*(undefined8 *)(pfVar5 + -0xc);
      fVar44 = fVar27 + fVar32;
      fVar33 = (float)((ulong)*(undefined8 *)(pfVar5 + -0xc) >> 0x20);
      fVar45 = fVar43 + fVar33;
      fVar28 = (float)*(undefined8 *)(pfVar5 + -6);
      fVar29 = (float)((ulong)*(undefined8 *)(pfVar5 + -6) >> 0x20);
      fVar30 = (float)*(undefined8 *)(pfVar5 + -0xe);
      fVar46 = fVar28 + fVar30;
      fVar31 = (float)((ulong)*(undefined8 *)(pfVar5 + -0xe) >> 0x20);
      fVar47 = fVar29 + fVar31;
      pfVar5[-6] = fVar46;
      pfVar5[-5] = fVar47;
      pfVar5[-4] = fVar44;
      pfVar5[-3] = fVar45;
      fVar40 = (float)*(undefined8 *)pfVar6;
      fVar38 = fVar26 + fVar40;
      fVar41 = (float)((ulong)*(undefined8 *)pfVar6 >> 0x20);
      fVar39 = fVar42 + fVar41;
      pfVar5[-4] = (fVar46 + fVar23) - (fVar44 + fVar38);
      pfVar5[-3] = (fVar47 + fVar25) - (fVar45 + fVar39);
      pfVar5[-2] = fVar44 + fVar38 + fVar46 + fVar23;
      pfVar5[-1] = fVar45 + fVar39 + fVar47 + fVar25;
      fVar34 = fVar34 - fVar36;
      fVar35 = fVar35 - fVar37;
      pfVar5[-10] = fVar34;
      pfVar5[-9] = fVar35;
      pfVar5[-8] = fVar38;
      pfVar5[-7] = fVar39;
      pfVar5[-8] = (fVar23 - fVar46) + (fVar45 - fVar39);
      pfVar5[-7] = (fVar25 - fVar47) - (fVar44 - fVar38);
      pfVar5[-6] = (fVar23 - fVar46) - (fVar45 - fVar39);
      pfVar5[-5] = (fVar25 - fVar47) + (fVar44 - fVar38);
      fVar42 = fVar42 - fVar41;
      fVar43 = fVar43 - fVar33;
      fVar26 = fVar26 - fVar40;
      fVar27 = fVar27 - fVar32;
      fVar40 = (fVar42 + fVar26) * -fVar24;
      fVar41 = (fVar43 + fVar27) * fVar24;
      fVar26 = (fVar26 - fVar42) * fVar24;
      fVar23 = (fVar27 - fVar43) * fVar24;
      fVar25 = fVar23 - fVar40;
      fVar28 = fVar28 - fVar30;
      fVar29 = fVar29 - fVar31;
      pfVar5[-0xe] = -fVar29;
      pfVar5[-0xd] = fVar28;
      pfVar5[-0xc] = fVar23;
      pfVar5[-0xb] = fVar41;
      pfVar5[-0xf] = fVar26;
      fVar23 = fVar23 + fVar40;
      pfVar5[-9] = fVar28 + fVar35 + fVar26 + fVar41;
      pfVar5[-0xd] = (fVar35 - fVar28) + fVar25;
      pfVar5[-0xf] = (fVar35 - fVar28) - fVar25;
      *(ulong *)(pfVar5 + -0xb) =
           CONCAT44((fVar34 - fVar29) + fVar23,(fVar28 + fVar35) - (fVar26 + fVar41));
      pfVar5[-0xc] = (fVar34 - fVar29) - fVar23;
      pfVar5[-0xe] = (fVar29 + fVar34) - (fVar41 - fVar26);
      *pfVar6 = fVar29 + fVar34 + (fVar41 - fVar26);
      pfVar8 = pfVar5 + -0x11;
      pfVar5 = pfVar6;
    } while (local_68 + (long)(int)local_90 + (long)(local_74 * -0x10) < pfVar8);
  }
  if (3 < local_4c) {
    pfVar5 = local_b0 + local_a0 + -4;
    puVar9 = local_b8->bit_reverse[local_a8];
    pfVar6 = local_b0 + local_88 + -1;
    do {
      uVar15 = (ulong)*puVar9;
      *pfVar6 = local_68[uVar15];
      pfVar6[-1] = local_68[uVar15 + 1];
      pfVar5[3] = local_68[uVar15 + 2];
      pfVar5[2] = local_68[uVar15 + 3];
      uVar15 = (ulong)puVar9[1];
      pfVar6[-2] = local_68[uVar15];
      pfVar6[-3] = local_68[uVar15 + 1];
      pfVar5[1] = local_68[uVar15 + 2];
      *pfVar5 = local_68[uVar15 + 3];
      pfVar5 = pfVar5 + -4;
      puVar9 = puVar9 + 2;
      pfVar6 = pfVar6 + -4;
    } while (local_b0 <= pfVar5);
  }
  pfVar5 = local_b0 + local_88 + -4;
  if (local_b0 < pfVar5) {
    pfVar6 = local_b8->C[local_a8];
    lVar20 = 0;
    do {
      fVar24 = *(float *)((long)pfVar6 + lVar20 + 4);
      puVar1 = (undefined8 *)((long)local_b0 + lVar20);
      fVar23 = (float)*puVar1;
      fVar25 = (float)((ulong)*puVar1 >> 0x20);
      fVar26 = (float)*(undefined8 *)(pfVar5 + 2);
      fVar42 = fVar23 - fVar26;
      fVar30 = (float)((ulong)*(undefined8 *)(pfVar5 + 2) >> 0x20);
      fVar27 = fVar25 - fVar30;
      fVar23 = fVar23 + fVar26;
      fVar25 = fVar25 + fVar30;
      fVar26 = fVar24 * fVar42 + *(float *)((long)pfVar6 + lVar20) * fVar25;
      fVar24 = fVar24 * fVar25 + -*(float *)((long)pfVar6 + lVar20) * fVar42;
      *puVar1 = CONCAT44(fVar27 + fVar24,fVar23 + fVar26);
      *(ulong *)(pfVar5 + 2) = CONCAT44(fVar24 - fVar27,fVar23 - fVar26);
      fVar24 = *(float *)((long)pfVar6 + lVar20 + 8);
      fVar26 = *(float *)((long)pfVar6 + lVar20 + 0xc);
      fVar25 = (float)puVar1[1];
      fVar42 = (float)((ulong)puVar1[1] >> 0x20);
      fVar23 = (float)*(undefined8 *)pfVar5;
      fVar30 = fVar25 - fVar23;
      fVar27 = (float)((ulong)*(undefined8 *)pfVar5 >> 0x20);
      fVar31 = fVar42 - fVar27;
      fVar25 = fVar25 + fVar23;
      fVar42 = fVar42 + fVar27;
      fVar23 = fVar26 * fVar30 + fVar24 * fVar42;
      fVar24 = fVar26 * fVar42 + -fVar24 * fVar30;
      puVar1[1] = CONCAT44(fVar31 + fVar24,fVar25 + fVar23);
      *pfVar5 = fVar25 - fVar23;
      pfVar5[1] = fVar24 - fVar31;
      pfVar5 = pfVar5 + -4;
      lVar20 = lVar20 + 0x10;
    } while (puVar1 + 2 < pfVar5);
  }
  if (local_b0 <= local_b0 + local_88 + -8) {
    lVar20 = (long)(int)local_34;
    pfVar5 = local_b0 + -1;
    pfVar10 = local_b8->B[local_a8] + -1;
    pfVar6 = local_68 + -1;
    local_68 = local_68 + 3;
    pfVar8 = local_b0;
    do {
      pfVar8 = pfVar8 + -8;
      fVar26 = pfVar5[local_88 + -1] * pfVar10[local_88] - pfVar10[local_88 + -1] * pfVar5[local_88]
      ;
      fVar24 = -pfVar5[local_88 + -1] * pfVar10[local_88 + -1] -
               pfVar10[local_88] * pfVar5[local_88];
      local_68[-3] = fVar26;
      pfVar6[local_88] = -fVar26;
      local_68[local_88 + -3] = fVar24;
      pfVar6[lVar20] = fVar24;
      fVar26 = pfVar5[local_88 + -3] * pfVar10[local_88 + -2] -
               pfVar10[local_88 + -3] * pfVar5[local_88 + -2];
      fVar24 = -pfVar5[local_88 + -3] * pfVar10[local_88 + -3] -
               pfVar10[local_88 + -2] * pfVar5[local_88 + -2];
      local_68[-2] = fVar26;
      pfVar6[local_88 + -1] = -fVar26;
      local_68[local_88 + -2] = fVar24;
      pfVar6[lVar20 + -1] = fVar24;
      fVar26 = pfVar5[local_88 + -5] * pfVar10[local_88 + -4] -
               pfVar10[local_88 + -5] * pfVar5[local_88 + -4];
      fVar24 = -pfVar5[local_88 + -5] * pfVar10[local_88 + -5] -
               pfVar10[local_88 + -4] * pfVar5[local_88 + -4];
      local_68[-1] = fVar26;
      pfVar6[local_88 + -2] = -fVar26;
      local_68[local_88 + -1] = fVar24;
      pfVar6[lVar20 + -2] = fVar24;
      fVar26 = pfVar5[local_88 + -7] * pfVar10[local_88 + -6] -
               pfVar10[local_88 + -7] * pfVar5[local_88 + -6];
      fVar24 = -pfVar5[local_88 + -7] * pfVar10[local_88 + -7] -
               pfVar10[local_88 + -6] * pfVar5[local_88 + -6];
      *local_68 = fVar26;
      pfVar6[local_88 + -3] = -fVar26;
      local_68[local_88] = fVar24;
      pfVar6[lVar20 + -3] = fVar24;
      pfVar5 = pfVar5 + -8;
      pfVar10 = pfVar10 + -8;
      pfVar6 = pfVar6 + -4;
      local_68 = local_68 + 4;
    } while (local_b0 <= pfVar8 + local_88 + -8);
  }
  local_b8->temp_offset = local_78;
  return;
}

Assistant:

static void inverse_mdct(float *buffer, int n, vorb *f, int blocktype)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3, l;
   int ld;
   // @OPTIMIZE: reduce register pressure by using fewer variables?
   int save_point = temp_alloc_save(f);
   float *buf2 = (float *) temp_alloc(f, n2 * sizeof(*buf2));
   float *u=NULL,*v=NULL;
   // twiddle factors
   float *A = f->A[blocktype];

   // IMDCT algorithm from "The use of multirate filter banks for coding of high quality digital audio"
   // See notes about bugs in that paper in less-optimal implementation 'inverse_mdct_old' after this function.

   // kernel from paper


   // merged:
   //   copy and reflect spectral data
   //   step 0

   // note that it turns out that the items added together during
   // this step are, in fact, being added to themselves (as reflected
   // by step 0). inexplicable inefficiency! this became obvious
   // once I combined the passes.

   // so there's a missing 'times 2' here (for adding X to itself).
   // this propagates through linearly to the end, where the numbers
   // are 1/2 too small, and need to be compensated for.

   {
      float *d,*e, *AA, *e_stop;
      d = &buf2[n2-2];
      AA = A;
      e = &buffer[0];
      e_stop = &buffer[n2];
      while (e != e_stop) {
         d[1] = (e[0] * AA[0] - e[2]*AA[1]);
         d[0] = (e[0] * AA[1] + e[2]*AA[0]);
         d -= 2;
         AA += 2;
         e += 4;
      }

      e = &buffer[n2-3];
      while (d >= buf2) {
         d[1] = (-e[2] * AA[0] - -e[0]*AA[1]);
         d[0] = (-e[2] * AA[1] + -e[0]*AA[0]);
         d -= 2;
         AA += 2;
         e -= 4;
      }
   }

   // now we use symbolic names for these, so that we can
   // possibly swap their meaning as we change which operations
   // are in place

   u = buffer;
   v = buf2;

   // step 2    (paper output is w, now u)
   // this could be in place, but the data ends up in the wrong
   // place... _somebody_'s got to swap it, so this is nominated
   {
      float *AA = &A[n2-8];
      float *d0,*d1, *e0, *e1;

      e0 = &v[n4];
      e1 = &v[0];

      d0 = &u[n4];
      d1 = &u[0];

      while (AA >= A) {
         float v40_20, v41_21;

         v41_21 = e0[1] - e1[1];
         v40_20 = e0[0] - e1[0];
         d0[1]  = e0[1] + e1[1];
         d0[0]  = e0[0] + e1[0];
         d1[1]  = v41_21*AA[4] - v40_20*AA[5];
         d1[0]  = v40_20*AA[4] + v41_21*AA[5];

         v41_21 = e0[3] - e1[3];
         v40_20 = e0[2] - e1[2];
         d0[3]  = e0[3] + e1[3];
         d0[2]  = e0[2] + e1[2];
         d1[3]  = v41_21*AA[0] - v40_20*AA[1];
         d1[2]  = v40_20*AA[0] + v41_21*AA[1];

         AA -= 8;

         d0 += 4;
         d1 += 4;
         e0 += 4;
         e1 += 4;
      }
   }

   // step 3
   ld = ilog(n) - 1; // ilog is off-by-one from normal definitions

   // optimized step 3:

   // the original step3 loop can be nested r inside s or s inside r;
   // it's written originally as s inside r, but this is dumb when r
   // iterates many times, and s few. So I have two copies of it and
   // switch between them halfway.

   // this is iteration 0 of step 3
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*0, -(n >> 3), A);
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*1, -(n >> 3), A);

   // this is iteration 1 of step 3
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*0, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*1, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*2, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*3, -(n >> 4), A, 16);

   l=2;
   for (; l < (ld-3)>>1; ++l) {
      int k0 = n >> (l+2), k0_2 = k0>>1;
      int lim = 1 << (l+1);
      int i;
      for (i=0; i < lim; ++i)
         imdct_step3_inner_r_loop(n >> (l+4), u, n2-1 - k0*i, -k0_2, A, 1 << (l+3));
   }

   for (; l < ld-6; ++l) {
      int k0 = n >> (l+2), k1 = 1 << (l+3), k0_2 = k0>>1;
      int rlim = n >> (l+6), r;
      int lim = 1 << (l+1);
      int i_off;
      float *A0 = A;
      i_off = n2-1;
      for (r=rlim; r > 0; --r) {
         imdct_step3_inner_s_loop(lim, u, i_off, -k0_2, A0, k1, k0);
         A0 += k1*4;
         i_off -= 8;
      }
   }

   // iterations with count:
   //   ld-6,-5,-4 all interleaved together
   //       the big win comes from getting rid of needless flops
   //         due to the constants on pass 5 & 4 being all 1 and 0;
   //       combining them to be simultaneous to improve cache made little difference
   imdct_step3_inner_s_loop_ld654(n >> 5, u, n2-1, A, n);

   // output is u

   // step 4, 5, and 6
   // cannot be in-place because of step 5
   {
      uint16 *bitrev = f->bit_reverse[blocktype];
      // weirdly, I'd have thought reading sequentially and writing
      // erratically would have been better than vice-versa, but in
      // fact that's not what my testing showed. (That is, with
      // j = bitreverse(i), do you read i and write j, or read j and write i.)

      float *d0 = &v[n4-4];
      float *d1 = &v[n2-4];
      while (d0 >= v) {
         int k4;

         k4 = bitrev[0];
         d1[3] = u[k4+0];
         d1[2] = u[k4+1];
         d0[3] = u[k4+2];
         d0[2] = u[k4+3];

         k4 = bitrev[1];
         d1[1] = u[k4+0];
         d1[0] = u[k4+1];
         d0[1] = u[k4+2];
         d0[0] = u[k4+3];

         d0 -= 4;
         d1 -= 4;
         bitrev += 2;
      }
   }
   // (paper output is u, now v)


   // data must be in buf2
   assert(v == buf2);

   // step 7   (paper output is v, now v)
   // this is now in place
   {
      float *C = f->C[blocktype];
      float *d, *e;

      d = v;
      e = v + n2 - 4;

      while (d < e) {
         float a02,a11,b0,b1,b2,b3;

         a02 = d[0] - e[2];
         a11 = d[1] + e[3];

         b0 = C[1]*a02 + C[0]*a11;
         b1 = C[1]*a11 - C[0]*a02;

         b2 = d[0] + e[ 2];
         b3 = d[1] - e[ 3];

         d[0] = b2 + b0;
         d[1] = b3 + b1;
         e[2] = b2 - b0;
         e[3] = b1 - b3;

         a02 = d[2] - e[0];
         a11 = d[3] + e[1];

         b0 = C[3]*a02 + C[2]*a11;
         b1 = C[3]*a11 - C[2]*a02;

         b2 = d[2] + e[ 0];
         b3 = d[3] - e[ 1];

         d[2] = b2 + b0;
         d[3] = b3 + b1;
         e[0] = b2 - b0;
         e[1] = b1 - b3;

         C += 4;
         d += 4;
         e -= 4;
      }
   }

   // data must be in buf2


   // step 8+decode   (paper output is X, now buffer)
   // this generates pairs of data a la 8 and pushes them directly through
   // the decode kernel (pushing rather than pulling) to avoid having
   // to make another pass later

   // this cannot POSSIBLY be in place, so we refer to the buffers directly

   {
      float *d0,*d1,*d2,*d3;

      float *B = f->B[blocktype] + n2 - 8;
      float *e = buf2 + n2 - 8;
      d0 = &buffer[0];
      d1 = &buffer[n2-4];
      d2 = &buffer[n2];
      d3 = &buffer[n-4];
      while (e >= v) {
         float p0,p1,p2,p3;

         p3 =  e[6]*B[7] - e[7]*B[6];
         p2 = -e[6]*B[6] - e[7]*B[7];

         d0[0] =   p3;
         d1[3] = - p3;
         d2[0] =   p2;
         d3[3] =   p2;

         p1 =  e[4]*B[5] - e[5]*B[4];
         p0 = -e[4]*B[4] - e[5]*B[5];

         d0[1] =   p1;
         d1[2] = - p1;
         d2[1] =   p0;
         d3[2] =   p0;

         p3 =  e[2]*B[3] - e[3]*B[2];
         p2 = -e[2]*B[2] - e[3]*B[3];

         d0[2] =   p3;
         d1[1] = - p3;
         d2[2] =   p2;
         d3[1] =   p2;

         p1 =  e[0]*B[1] - e[1]*B[0];
         p0 = -e[0]*B[0] - e[1]*B[1];

         d0[3] =   p1;
         d1[0] = - p1;
         d2[3] =   p0;
         d3[0] =   p0;

         B -= 8;
         e -= 8;
         d0 += 4;
         d2 += 4;
         d1 -= 4;
         d3 -= 4;
      }
   }

   temp_free(f,buf2);
   temp_alloc_restore(f,save_point);
}